

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_serialiserscommon.cpp
# Opt level: O1

void __thiscall
tst_SerialiserCommon::saveLoadFile
          (tst_SerialiserCommon *this,AbstractModelSerialiser *serialiser,
          QAbstractItemModel *sourceModel,QAbstractItemModel *destinationModel,bool multiRole,
          bool checkHeaders)

{
  bool bVar1;
  char cVar2;
  undefined7 in_register_00000081;
  QTemporaryFile tempFile;
  long local_70 [2];
  QModelIndex local_60;
  QModelIndex local_48;
  
  AbstractModelSerialiser::setModel((QAbstractItemModel *)serialiser);
  if ((int)CONCAT71(in_register_00000081,multiRole) != 0) {
    (**(code **)(*(long *)serialiser + 0x70))(serialiser,0x101);
  }
  QTemporaryFile::QTemporaryFile((QTemporaryFile *)local_70);
  bVar1 = (bool)(**(code **)(local_70[0] + 0x68))((QTemporaryFile *)local_70,3);
  cVar2 = QTest::qVerify(bVar1,"tempFile.open()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                         ,0x1b);
  if (cVar2 != '\0') {
    bVar1 = (bool)(**(code **)(*(long *)serialiser + 0xa0))(serialiser,local_70);
    cVar2 = QTest::qVerify(bVar1,"serialiser->saveModel(&tempFile)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                           ,0x1c);
    if (cVar2 != '\0') {
      bVar1 = (bool)QFileDevice::seek((longlong)local_70);
      cVar2 = QTest::qVerify(bVar1,"tempFile.seek(0)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                             ,0x1d);
      if (cVar2 != '\0') {
        AbstractModelSerialiser::setModel((QAbstractItemModel *)serialiser);
        bVar1 = (bool)(**(code **)(*(long *)serialiser + 0xb0))(serialiser,local_70);
        cVar2 = QTest::qVerify(bVar1,"serialiser->loadModel(&tempFile)","",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                               ,0x1f);
        if (cVar2 != '\0') {
          local_48.r = -1;
          local_48.c = -1;
          local_48.i = 0;
          local_48.m = (QAbstractItemModel *)0x0;
          local_60.r = -1;
          local_60.c = -1;
          local_60.i = 0;
          local_60.m = (QAbstractItemModel *)0x0;
          checkModelEqual(this,sourceModel,destinationModel,&local_48,&local_60,checkHeaders);
        }
      }
    }
  }
  QTemporaryFile::~QTemporaryFile((QTemporaryFile *)local_70);
  return;
}

Assistant:

void tst_SerialiserCommon::saveLoadFile(AbstractModelSerialiser *serialiser, const QAbstractItemModel *sourceModel,
                                        QAbstractItemModel *destinationModel, bool multiRole, bool checkHeaders) const
{
    serialiser->setModel(sourceModel);
    if (multiRole)
        serialiser->addRoleToSave(Qt::UserRole + 1);
    QTemporaryFile tempFile;
    QVERIFY(tempFile.open());
    QVERIFY(serialiser->saveModel(&tempFile));
    QVERIFY(tempFile.seek(0));
    serialiser->setModel(destinationModel);
    QVERIFY(serialiser->loadModel(&tempFile));
    checkModelEqual(sourceModel, destinationModel, QModelIndex(), QModelIndex(), checkHeaders);
}